

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_hash_map.h
# Opt level: O0

void __thiscall
crnlib::
hash_map<crnlib::vec<2U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<2U,_float>_>,_crnlib::equal_to<crnlib::vec<2U,_float>_>_>
::swap(hash_map<crnlib::vec<2U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<2U,_float>_>,_crnlib::equal_to<crnlib::vec<2U,_float>_>_>
       *this,hash_map_type *other)

{
  hash_map_type *other_local;
  hash_map<crnlib::vec<2U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<2U,_float>_>,_crnlib::equal_to<crnlib::vec<2U,_float>_>_>
  *this_local;
  
  vector<crnlib::hash_map<crnlib::vec<2U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<2U,_float>_>,_crnlib::equal_to<crnlib::vec<2U,_float>_>_>::raw_node>
  ::swap(&this->m_values,&other->m_values);
  std::swap<unsigned_int>(&this->m_hash_shift,&other->m_hash_shift);
  std::swap<unsigned_int>(&this->m_num_valid,&other->m_num_valid);
  std::swap<unsigned_int>(&this->m_grow_threshold,&other->m_grow_threshold);
  std::swap<crnlib::hasher<crnlib::vec<2u,float>>>
            ((hasher<crnlib::vec<2U,_float>_> *)&this->field_0x14,
             (hasher<crnlib::vec<2U,_float>_> *)&other->field_0x14);
  std::swap<crnlib::equal_to<crnlib::vec<2u,float>>>
            ((equal_to<crnlib::vec<2U,_float>_> *)&this->field_0x15,
             (equal_to<crnlib::vec<2U,_float>_> *)&other->field_0x15);
  return;
}

Assistant:

inline void swap(hash_map_type& other)
        {
            m_values.swap(other.m_values);
            std::swap(m_hash_shift, other.m_hash_shift);
            std::swap(m_num_valid, other.m_num_valid);
            std::swap(m_grow_threshold, other.m_grow_threshold);
            std::swap(m_hasher, other.m_hasher);
            std::swap(m_equals, other.m_equals);
        }